

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

_Bool Open_JTalk_generate_sounddata
                (Open_JTalk *open_jtalk,char *txt,short **sounddata,size_t *size,
                size_t *sampling_frequency)

{
  double dVar1;
  HTS_Boolean HVar2;
  int iVar3;
  NJD *njd;
  HTS_Engine *engine;
  void **ppvVar4;
  NJDNode *__nmemb;
  JPCommonNode *pJVar5;
  NJD *in_RCX;
  JPCommon *in_RDX;
  Mecab *in_RDI;
  undefined8 *in_R8;
  NJD *unaff_retaddr;
  double x;
  uint i;
  short *data;
  size_t len;
  HTS_GStreamSet *gss;
  short temp;
  char buff [1024];
  JPCommon *in_stack_fffffffffffffb78;
  Mecab *pMVar6;
  NJD *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  uint uVar7;
  JPCommon *in_stack_fffffffffffffbb0;
  undefined2 local_43a;
  NJD *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbf0;
  Mecab *in_stack_fffffffffffffbf8;
  
  if (in_RDI != (Mecab *)0x0) {
    text2mecab((char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    Mecab_analysis(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    pMVar6 = in_RDI + 1;
    njd = (NJD *)Mecab_get_feature(in_RDI);
    Mecab_get_size(in_RDI);
    mecab2njd(njd,(char **)pMVar6,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
    njd_set_pronunciation(in_stack_fffffffffffffbd0);
    njd_set_digit((NJD *)in_stack_fffffffffffffbb0);
    njd_set_accent_phrase(in_stack_fffffffffffffb80);
    njd_set_accent_type((NJD *)in_RDI);
    njd_set_unvoiced_vowel(unaff_retaddr);
    njd_set_long_vowel((NJD *)(in_RDI + 1));
    njd2jpcommon(in_RDX,in_RCX);
    JPCommon_make_label(in_stack_fffffffffffffbb0);
    iVar3 = JPCommon_get_label_size(in_stack_fffffffffffffb78);
    if (2 < iVar3) {
      pMVar6 = in_RDI + 2;
      engine = (HTS_Engine *)JPCommon_get_label_feature((JPCommon *)pMVar6);
      JPCommon_get_label_size((JPCommon *)pMVar6);
      HVar2 = HTS_Engine_synthesize_from_strings(engine,(char **)pMVar6,0x19e6c2);
      if (HVar2 == '\x01') {
        ppvVar4 = &in_RDI[0xb].tagger;
        __nmemb = (NJDNode *)((((ulong)*ppvVar4 >> 10) + 1) * 0x400);
        pMVar6 = in_RDI;
        pJVar5 = (JPCommonNode *)calloc((size_t)__nmemb,2);
        for (uVar7 = 0; (void *)(ulong)uVar7 < *ppvVar4; uVar7 = uVar7 + 1) {
          dVar1 = *(double *)((long)in_RDI[0xc].model + (ulong)uVar7 * 8);
          if (dVar1 <= 32767.0) {
            if (-32768.0 <= dVar1) {
              local_43a = (undefined2)(int)dVar1;
            }
            else {
              local_43a = 0x8000;
            }
          }
          else {
            local_43a = 0x7fff;
          }
          *(undefined2 *)((long)&pJVar5->pron + (ulong)uVar7 * 2) = local_43a;
        }
        if (__nmemb != (NJDNode *)*ppvVar4) {
          memset((void *)((long)&pJVar5->pron + (long)*ppvVar4 * 2),0,(long)__nmemb - (long)*ppvVar4
                );
        }
        in_RDX->head = pJVar5;
        in_RCX->head = __nmemb;
        *in_R8 = pMVar6[2].feature;
        Open_JTalk_refresh((Open_JTalk *)0x19e827);
        return true;
      }
    }
    Open_JTalk_refresh((Open_JTalk *)0x19e840);
  }
  return false;
}

Assistant:

bool Open_JTalk_generate_sounddata(Open_JTalk *open_jtalk,
								   const char *txt,
								   short **sounddata,
								   size_t *size,
								   size_t *sampling_frequency)
{
	if (open_jtalk == NULL)
	{
		return false;
	}
	char buff[MAXBUFLEN];
	text2mecab(buff, txt);
	Mecab_analysis(&open_jtalk->mecab, buff);
	mecab2njd(&open_jtalk->njd, Mecab_get_feature(&open_jtalk->mecab),
			  Mecab_get_size(&open_jtalk->mecab));
	njd_set_pronunciation(&open_jtalk->njd);
	njd_set_digit(&open_jtalk->njd);
	njd_set_accent_phrase(&open_jtalk->njd);
	njd_set_accent_type(&open_jtalk->njd);
	njd_set_unvoiced_vowel(&open_jtalk->njd);
	njd_set_long_vowel(&open_jtalk->njd);
	njd2jpcommon(&open_jtalk->jpcommon, &open_jtalk->njd);
	JPCommon_make_label(&open_jtalk->jpcommon);
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		if (HTS_Engine_synthesize_from_strings(
				&open_jtalk->engine,
				JPCommon_get_label_feature(&open_jtalk->jpcommon), JPCommon_get_label_size(&open_jtalk->jpcommon)) == TRUE)
		{
			short temp;
			HTS_GStreamSet *gss = &open_jtalk->engine.gss;
			size_t len = (gss->total_nsample / OPEN_JTALK_BLOCKSIZE + 1) * OPEN_JTALK_BLOCKSIZE;
			short *data = (short *)calloc(len, sizeof(short));
			for (unsigned int i = 0; i < gss->total_nsample; i++)
			{
				double x = gss->gspeech[i];
				if (x > 32767.0)
				{
					temp = 32767;
				}
				else if (x < -32768.0)
				{
					temp = -32768;
				}
				else
				{
					temp = (short)x;
				}
				data[i] = temp;
			}
			if (len != gss->total_nsample)
			{
				memset(data + gss->total_nsample, '\0', len - gss->total_nsample);
			}
			*sounddata = data;
			*size = len;
			*sampling_frequency = (&open_jtalk->engine)->condition.sampling_frequency;
			Open_JTalk_refresh(open_jtalk);
			return true;
		}
	}
	Open_JTalk_refresh(open_jtalk);
	return false;
}